

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

int Of_ManComputeForwardDirconObj(Of_Man_t *p,int iObj)

{
  uint uVar1;
  Of_Obj_t *pOVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint *puVar8;
  uint *puVar9;
  int iVar10;
  uint *puVar11;
  uint *pCut;
  int Delay2This;
  int Delay1This;
  int local_50;
  int local_4c;
  ulong local_48;
  uint *local_40;
  uint *local_38;
  
  uVar7 = (ulong)(uint)iObj;
  if ((-1 < iObj) && (iObj < (p->vCutSets).nSize)) {
    local_48 = (ulong)(uint)iObj;
    uVar1 = (p->vCutSets).pArray[local_48];
    uVar4 = (int)uVar1 >> 0x10;
    if (((int)uVar4 < 0) || ((p->vPages).nSize <= (int)uVar4)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    puVar8 = (uint *)((long)(p->vPages).pArray[uVar4] + (ulong)(uVar1 & 0xffff) * 4);
    iVar6 = 0;
    if ((int)*puVar8 < 1) {
      iVar5 = 1000000000;
      puVar9 = (uint *)0x0;
      puVar11 = (uint *)0x0;
      iVar10 = 1000000000;
    }
    else {
      pCut = puVar8 + 1;
      iVar10 = 1000000000;
      puVar11 = (uint *)0x0;
      puVar9 = (uint *)0x0;
      iVar5 = 1000000000;
      local_40 = puVar8;
      do {
        local_38 = puVar9;
        Of_ManComputeForwardDirconCut(p,(int)uVar7,(int *)pCut,&local_4c,&local_50);
        puVar9 = local_38;
        if (local_4c < iVar10) {
          puVar9 = pCut;
        }
        if (local_4c <= iVar10) {
          iVar10 = local_4c;
        }
        if (local_50 < iVar5) {
          puVar11 = pCut;
        }
        if (local_50 <= iVar5) {
          iVar5 = local_50;
        }
        iVar6 = iVar6 + 1;
        pCut = pCut + (ulong)(*pCut & 0x1f) + 4;
        puVar8 = local_40;
      } while (iVar6 < (int)*local_40);
    }
    pOVar2 = p->pObjs;
    pOVar2[local_48].Delay1 = iVar10;
    pOVar2[local_48].Delay2 = iVar5;
    if (iObj < (p->vCutSets).nSize) {
      if (puVar8 <= puVar9 && (long)puVar9 - (long)puVar8 != 0) {
        piVar3 = (p->vCutSets).pArray;
        pOVar2[local_48].iCutH = (int)((ulong)((long)puVar9 - (long)puVar8) >> 2) + piVar3[local_48]
        ;
        if (puVar8 <= puVar11 && (long)puVar11 - (long)puVar8 != 0) {
          pOVar2[local_48].iCutH2 =
               (int)((ulong)((long)puVar11 - (long)puVar8) >> 2) + piVar3[local_48];
          return iVar10;
        }
      }
      __assert_fail("pCut > pCutSet",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                    ,0x6c,"int Of_CutHandle(int *, int *)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Of_ManComputeForwardDirconObj( Of_Man_t * p, int iObj )
{
    int Delay1 = ABC_INFINITY, Delay2 = ABC_INFINITY;
    int i, * pCut, * pCutMin = NULL, * pCutMin2 = NULL, * pList = Of_ObjCutSet(p, iObj);
    Of_SetForEachCut( pList, pCut, i )
    {
        int Delay1This, Delay2This;
        Of_ManComputeForwardDirconCut( p, iObj, pCut, &Delay1This, &Delay2This );
        if ( Delay1 > Delay1This )
            pCutMin = pCut;
        if ( Delay2 > Delay2This )
            pCutMin2 = pCut;
        Delay1 = Abc_MinInt( Delay1, Delay1This );
        Delay2 = Abc_MinInt( Delay2, Delay2This );
    }
    Of_ObjSetDelay1( p, iObj, Delay1 );
    Of_ObjSetDelay2( p, iObj, Delay2 );
    Of_ObjSetCutBestP( p, pList, iObj, pCutMin );
    Of_ObjSetCutBestP2( p, pList, iObj, pCutMin2 );
    return Delay1;
}